

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode servercert(Curl_easy *data,connectdata *conn,ssl_connect_data *connssl,_Bool strict)

{
  byte bVar1;
  ssl_backend_data *psVar2;
  curl_blob *pcVar3;
  ssl_config_data *psVar4;
  int iVar5;
  BIO_METHOD *pBVar6;
  BIO *fp_00;
  ulong uVar7;
  char *pcVar8;
  X509 *pXVar9;
  X509_NAME *pXVar10;
  ASN1_TIME *pAVar11;
  X509 *issuer_00;
  long lVar12;
  bool bVar13;
  BIO *local_a50;
  long *local_a38;
  char *local_a28;
  char *local_a18;
  char *local_a08;
  char *local_9f8;
  char *local_9e8;
  curl_blob *local_9c8;
  curl_blob *local_9b8;
  char **local_9a0;
  long len;
  ssl_backend_data *backend;
  BIO *mem;
  char *ptr;
  char buffer [2048];
  char error_buffer [256];
  BIO *local_50;
  BIO *fp;
  X509 *issuer;
  long lerr;
  CURLcode local_30;
  int rc;
  CURLcode result;
  _Bool strict_local;
  ssl_connect_data *connssl_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  local_30 = CURLE_OK;
  memset(buffer + 0x7f8,0,0x100);
  pBVar6 = BIO_s_mem();
  fp_00 = BIO_new(pBVar6);
  psVar2 = connssl->backend;
  if (fp_00 == (BIO *)0x0) {
    uVar7 = ERR_get_error();
    pcVar8 = ossl_strerror(uVar7,buffer + 0x7f8,0x100);
    Curl_failf(data,"BIO_new return NULL, OpenSSL error %s",pcVar8);
    return CURLE_OUT_OF_MEMORY;
  }
  if (((data->set).ssl.field_0xb8 & 1) != 0) {
    Curl_ossl_certchain(data,connssl->backend->handle);
  }
  pXVar9 = (X509 *)SSL_get1_peer_certificate(psVar2->handle);
  psVar2->server_cert = pXVar9;
  if (psVar2->server_cert == (X509 *)0x0) {
    BIO_free(fp_00);
    if (!strict) {
      return CURLE_OK;
    }
    Curl_failf(data,"SSL: couldn\'t get peer certificate");
    return CURLE_PEER_FAILED_VERIFICATION;
  }
  bVar13 = false;
  if ((conn->http_proxy).proxytype == '\x02') {
    bVar13 = conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete;
  }
  pcVar8 = "Server";
  if (bVar13) {
    pcVar8 = "Proxy";
  }
  Curl_infof(data,"%s certificate:",pcVar8);
  pXVar10 = X509_get_subject_name((X509 *)psVar2->server_cert);
  iVar5 = x509_name_oneline((X509_NAME *)pXVar10,(char *)&ptr,0x800);
  if (iVar5 == 0) {
    local_9a0 = &ptr;
  }
  else {
    local_9a0 = (char **)0xc229de;
  }
  Curl_infof(data," subject: %s",local_9a0);
  pAVar11 = (ASN1_TIME *)X509_get0_notBefore(psVar2->server_cert);
  ASN1_TIME_print(fp_00,pAVar11);
  uVar7 = BIO_ctrl(fp_00,3,0,&mem);
  Curl_infof(data," start date: %.*s",uVar7 & 0xffffffff,mem);
  BIO_ctrl(fp_00,1,0,(void *)0x0);
  pAVar11 = (ASN1_TIME *)X509_get0_notAfter(psVar2->server_cert);
  ASN1_TIME_print(fp_00,pAVar11);
  uVar7 = BIO_ctrl(fp_00,3,0,&mem);
  Curl_infof(data," expire date: %.*s",uVar7 & 0xffffffff,mem);
  BIO_ctrl(fp_00,1,0,(void *)0x0);
  BIO_free(fp_00);
  if (((conn->http_proxy).proxytype == '\x02') &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    bVar1 = (conn->proxy_ssl_config).field_0x71;
  }
  else {
    bVar1 = (conn->ssl_config).field_0x71;
  }
  if (((bVar1 >> 1 & 1) != 0) &&
     (local_30 = Curl_ossl_verifyhost(data,conn,psVar2->server_cert), local_30 != CURLE_OK)) {
    X509_free((X509 *)psVar2->server_cert);
    psVar2->server_cert = (X509 *)0x0;
    return local_30;
  }
  pXVar10 = X509_get_issuer_name((X509 *)psVar2->server_cert);
  iVar5 = x509_name_oneline((X509_NAME *)pXVar10,(char *)&ptr,0x800);
  if (iVar5 != 0) {
    if (strict) {
      Curl_failf(data,"SSL: couldn\'t get X509-issuer name");
    }
    local_30 = CURLE_PEER_FAILED_VERIFICATION;
    goto LAB_0091a539;
  }
  Curl_infof(data," issuer: %s",&ptr);
  if (((conn->http_proxy).proxytype == '\x02') &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    if ((conn->proxy_ssl_config).issuercert != (char *)0x0) goto LAB_00919d0c;
LAB_00919c9f:
    if (((conn->http_proxy).proxytype == '\x02') &&
       (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
      pcVar3 = (conn->proxy_ssl_config).issuercert_blob;
    }
    else {
      pcVar3 = (conn->ssl_config).issuercert_blob;
    }
    if (pcVar3 != (curl_blob *)0x0) goto LAB_00919d0c;
  }
  else {
    if ((conn->ssl_config).issuercert == (char *)0x0) goto LAB_00919c9f;
LAB_00919d0c:
    if (((conn->http_proxy).proxytype == '\x02') &&
       (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
      if ((conn->proxy_ssl_config).issuercert_blob != (curl_blob *)0x0) goto LAB_00919d79;
LAB_00919ef6:
      pBVar6 = BIO_s_file();
      local_50 = BIO_new(pBVar6);
      if (local_50 == (BIO *)0x0) {
        uVar7 = ERR_get_error();
        pcVar8 = ossl_strerror(uVar7,buffer + 0x7f8,0x100);
        Curl_failf(data,"BIO_new return NULL, OpenSSL error %s",pcVar8);
        X509_free((X509 *)psVar2->server_cert);
        psVar2->server_cert = (X509 *)0x0;
        return CURLE_OUT_OF_MEMORY;
      }
      if (((conn->http_proxy).proxytype == '\x02') &&
         (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
        local_9e8 = (conn->proxy_ssl_config).issuercert;
      }
      else {
        local_9e8 = (conn->ssl_config).issuercert;
      }
      lVar12 = BIO_ctrl(local_50,0x6c,3,local_9e8);
      if ((int)lVar12 < 1) {
        if (strict) {
          if (((conn->http_proxy).proxytype == '\x02') &&
             (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
            local_9f8 = (conn->proxy_ssl_config).issuercert;
          }
          else {
            local_9f8 = (conn->ssl_config).issuercert;
          }
          Curl_failf(data,"SSL: Unable to open issuer cert (%s)",local_9f8);
        }
        BIO_free(local_50);
        X509_free((X509 *)psVar2->server_cert);
        psVar2->server_cert = (X509 *)0x0;
        return CURLE_SSL_ISSUER_ERROR;
      }
    }
    else {
      if ((conn->ssl_config).issuercert_blob == (curl_blob *)0x0) goto LAB_00919ef6;
LAB_00919d79:
      if (((conn->http_proxy).proxytype == '\x02') &&
         (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
        local_9b8 = (conn->proxy_ssl_config).issuercert_blob;
      }
      else {
        local_9b8 = (conn->ssl_config).issuercert_blob;
      }
      if (((conn->http_proxy).proxytype == '\x02') &&
         (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
        local_9c8 = (conn->proxy_ssl_config).issuercert_blob;
      }
      else {
        local_9c8 = (conn->ssl_config).issuercert_blob;
      }
      local_50 = BIO_new_mem_buf(local_9b8->data,(int)local_9c8->len);
      if (local_50 == (BIO *)0x0) {
        uVar7 = ERR_get_error();
        pcVar8 = ossl_strerror(uVar7,buffer + 0x7f8,0x100);
        Curl_failf(data,"BIO_new_mem_buf NULL, OpenSSL error %s",pcVar8);
        X509_free((X509 *)psVar2->server_cert);
        psVar2->server_cert = (X509 *)0x0;
        return CURLE_OUT_OF_MEMORY;
      }
    }
    issuer_00 = PEM_read_bio_X509(local_50,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
    if (issuer_00 == (X509 *)0x0) {
      if (strict) {
        if (((conn->http_proxy).proxytype == '\x02') &&
           (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
          local_a08 = (conn->proxy_ssl_config).issuercert;
        }
        else {
          local_a08 = (conn->ssl_config).issuercert;
        }
        Curl_failf(data,"SSL: Unable to read issuer cert (%s)",local_a08);
      }
      BIO_free(local_50);
      X509_free((X509 *)0x0);
      X509_free((X509 *)psVar2->server_cert);
      psVar2->server_cert = (X509 *)0x0;
      return CURLE_SSL_ISSUER_ERROR;
    }
    iVar5 = X509_check_issued(issuer_00,(X509 *)psVar2->server_cert);
    if (iVar5 != 0) {
      if (strict) {
        if (((conn->http_proxy).proxytype == '\x02') &&
           (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
          local_a18 = (conn->proxy_ssl_config).issuercert;
        }
        else {
          local_a18 = (conn->ssl_config).issuercert;
        }
        Curl_failf(data,"SSL: Certificate issuer check failed (%s)",local_a18);
      }
      BIO_free(local_50);
      X509_free(issuer_00);
      X509_free((X509 *)psVar2->server_cert);
      psVar2->server_cert = (X509 *)0x0;
      return CURLE_SSL_ISSUER_ERROR;
    }
    if (((conn->http_proxy).proxytype == '\x02') &&
       (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
      local_a28 = (conn->proxy_ssl_config).issuercert;
    }
    else {
      local_a28 = (conn->ssl_config).issuercert;
    }
    Curl_infof(data," SSL certificate issuer check ok (%s)",local_a28);
    BIO_free(local_50);
    X509_free(issuer_00);
  }
  lVar12 = SSL_get_verify_result((SSL *)psVar2->handle);
  if (((conn->http_proxy).proxytype == '\x02') &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    psVar4 = &(data->set).proxy_ssl;
  }
  else {
    psVar4 = &(data->set).ssl;
  }
  local_a38 = &psVar4->certverifyresult;
  *local_a38 = lVar12;
  if (lVar12 == 0) {
    Curl_infof(data," SSL certificate verify ok.");
  }
  else {
    if (((conn->http_proxy).proxytype == '\x02') &&
       (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
      bVar1 = (conn->proxy_ssl_config).field_0x71;
    }
    else {
      bVar1 = (conn->ssl_config).field_0x71;
    }
    if ((bVar1 & 1) == 0) {
      pcVar8 = X509_verify_cert_error_string(lVar12);
      Curl_infof(data," SSL certificate verify result: %s (%ld), continuing anyway.",pcVar8,lVar12);
    }
    else {
      if (strict) {
        pcVar8 = X509_verify_cert_error_string(lVar12);
        Curl_failf(data,"SSL certificate verify result: %s (%ld)",pcVar8,lVar12);
      }
      local_30 = CURLE_PEER_FAILED_VERIFICATION;
    }
  }
LAB_0091a539:
  if (((conn->http_proxy).proxytype == '\x02') &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    bVar1 = (conn->proxy_ssl_config).field_0x71;
  }
  else {
    bVar1 = (conn->ssl_config).field_0x71;
  }
  if (((bVar1 >> 2 & 1) == 0) || (local_30 = verifystatus(data,connssl), local_30 == CURLE_OK)) {
    if (!strict) {
      local_30 = CURLE_OK;
    }
    if (((conn->http_proxy).proxytype == '\x02') &&
       (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
      local_a50 = (BIO *)(data->set).str[0x1f];
    }
    else {
      local_a50 = (BIO *)(data->set).str[0x1e];
    }
    mem = local_a50;
    if (((local_30 == CURLE_OK) && (local_a50 != (BIO *)0x0)) &&
       (local_30 = pkp_pin_peer_pubkey(data,psVar2->server_cert,(char *)local_a50),
       local_30 != CURLE_OK)) {
      Curl_failf(data,"SSL: public key does not match pinned public key");
    }
    X509_free((X509 *)psVar2->server_cert);
    psVar2->server_cert = (X509 *)0x0;
    connssl->connecting_state = ssl_connect_done;
    data_local._4_4_ = local_30;
  }
  else {
    X509_free((X509 *)psVar2->server_cert);
    psVar2->server_cert = (X509 *)0x0;
    data_local._4_4_ = local_30;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode servercert(struct Curl_easy *data,
                           struct connectdata *conn,
                           struct ssl_connect_data *connssl,
                           bool strict)
{
  CURLcode result = CURLE_OK;
  int rc;
  long lerr;
  X509 *issuer;
  BIO *fp = NULL;
  char error_buffer[256]="";
  char buffer[2048];
  const char *ptr;
  BIO *mem = BIO_new(BIO_s_mem());
  struct ssl_backend_data *backend = connssl->backend;

  DEBUGASSERT(backend);

  if(!mem) {
    failf(data,
          "BIO_new return NULL, " OSSL_PACKAGE
          " error %s",
          ossl_strerror(ERR_get_error(), error_buffer,
                        sizeof(error_buffer)) );
    return CURLE_OUT_OF_MEMORY;
  }

  if(data->set.ssl.certinfo)
    /* asked to gather certificate info */
    (void)Curl_ossl_certchain(data, connssl->backend->handle);

  backend->server_cert = SSL_get1_peer_certificate(backend->handle);
  if(!backend->server_cert) {
    BIO_free(mem);
    if(!strict)
      return CURLE_OK;

    failf(data, "SSL: couldn't get peer certificate");
    return CURLE_PEER_FAILED_VERIFICATION;
  }

  infof(data, "%s certificate:", SSL_IS_PROXY() ? "Proxy" : "Server");

  rc = x509_name_oneline(X509_get_subject_name(backend->server_cert),
                         buffer, sizeof(buffer));
  infof(data, " subject: %s", rc?"[NONE]":buffer);

#ifndef CURL_DISABLE_VERBOSE_STRINGS
  {
    long len;
    ASN1_TIME_print(mem, X509_get0_notBefore(backend->server_cert));
    len = BIO_get_mem_data(mem, (char **) &ptr);
    infof(data, " start date: %.*s", (int)len, ptr);
    (void)BIO_reset(mem);

    ASN1_TIME_print(mem, X509_get0_notAfter(backend->server_cert));
    len = BIO_get_mem_data(mem, (char **) &ptr);
    infof(data, " expire date: %.*s", (int)len, ptr);
    (void)BIO_reset(mem);
  }
#endif

  BIO_free(mem);

  if(SSL_CONN_CONFIG(verifyhost)) {
    result = Curl_ossl_verifyhost(data, conn, backend->server_cert);
    if(result) {
      X509_free(backend->server_cert);
      backend->server_cert = NULL;
      return result;
    }
  }

  rc = x509_name_oneline(X509_get_issuer_name(backend->server_cert),
                         buffer, sizeof(buffer));
  if(rc) {
    if(strict)
      failf(data, "SSL: couldn't get X509-issuer name");
    result = CURLE_PEER_FAILED_VERIFICATION;
  }
  else {
    infof(data, " issuer: %s", buffer);

    /* We could do all sorts of certificate verification stuff here before
       deallocating the certificate. */

    /* e.g. match issuer name with provided issuer certificate */
    if(SSL_CONN_CONFIG(issuercert) || SSL_CONN_CONFIG(issuercert_blob)) {
      if(SSL_CONN_CONFIG(issuercert_blob)) {
        fp = BIO_new_mem_buf(SSL_CONN_CONFIG(issuercert_blob)->data,
                             (int)SSL_CONN_CONFIG(issuercert_blob)->len);
        if(!fp) {
          failf(data,
                "BIO_new_mem_buf NULL, " OSSL_PACKAGE
                " error %s",
                ossl_strerror(ERR_get_error(), error_buffer,
                              sizeof(error_buffer)) );
          X509_free(backend->server_cert);
          backend->server_cert = NULL;
          return CURLE_OUT_OF_MEMORY;
        }
      }
      else {
        fp = BIO_new(BIO_s_file());
        if(!fp) {
          failf(data,
                "BIO_new return NULL, " OSSL_PACKAGE
                " error %s",
                ossl_strerror(ERR_get_error(), error_buffer,
                              sizeof(error_buffer)) );
          X509_free(backend->server_cert);
          backend->server_cert = NULL;
          return CURLE_OUT_OF_MEMORY;
        }

        if(BIO_read_filename(fp, SSL_CONN_CONFIG(issuercert)) <= 0) {
          if(strict)
            failf(data, "SSL: Unable to open issuer cert (%s)",
                  SSL_CONN_CONFIG(issuercert));
          BIO_free(fp);
          X509_free(backend->server_cert);
          backend->server_cert = NULL;
          return CURLE_SSL_ISSUER_ERROR;
        }
      }

      issuer = PEM_read_bio_X509(fp, NULL, ZERO_NULL, NULL);
      if(!issuer) {
        if(strict)
          failf(data, "SSL: Unable to read issuer cert (%s)",
                SSL_CONN_CONFIG(issuercert));
        BIO_free(fp);
        X509_free(issuer);
        X509_free(backend->server_cert);
        backend->server_cert = NULL;
        return CURLE_SSL_ISSUER_ERROR;
      }

      if(X509_check_issued(issuer, backend->server_cert) != X509_V_OK) {
        if(strict)
          failf(data, "SSL: Certificate issuer check failed (%s)",
                SSL_CONN_CONFIG(issuercert));
        BIO_free(fp);
        X509_free(issuer);
        X509_free(backend->server_cert);
        backend->server_cert = NULL;
        return CURLE_SSL_ISSUER_ERROR;
      }

      infof(data, " SSL certificate issuer check ok (%s)",
            SSL_CONN_CONFIG(issuercert));
      BIO_free(fp);
      X509_free(issuer);
    }

    lerr = SSL_get_verify_result(backend->handle);
    SSL_SET_OPTION_LVALUE(certverifyresult) = lerr;
    if(lerr != X509_V_OK) {
      if(SSL_CONN_CONFIG(verifypeer)) {
        /* We probably never reach this, because SSL_connect() will fail
           and we return earlier if verifypeer is set? */
        if(strict)
          failf(data, "SSL certificate verify result: %s (%ld)",
                X509_verify_cert_error_string(lerr), lerr);
        result = CURLE_PEER_FAILED_VERIFICATION;
      }
      else
        infof(data, " SSL certificate verify result: %s (%ld),"
              " continuing anyway.",
              X509_verify_cert_error_string(lerr), lerr);
    }
    else
      infof(data, " SSL certificate verify ok.");
  }

#if (OPENSSL_VERSION_NUMBER >= 0x0090808fL) && !defined(OPENSSL_NO_TLSEXT) && \
    !defined(OPENSSL_NO_OCSP)
  if(SSL_CONN_CONFIG(verifystatus)) {
    result = verifystatus(data, connssl);
    if(result) {
      X509_free(backend->server_cert);
      backend->server_cert = NULL;
      return result;
    }
  }
#endif

  if(!strict)
    /* when not strict, we don't bother about the verify cert problems */
    result = CURLE_OK;

  ptr = SSL_PINNED_PUB_KEY();
  if(!result && ptr) {
    result = pkp_pin_peer_pubkey(data, backend->server_cert, ptr);
    if(result)
      failf(data, "SSL: public key does not match pinned public key");
  }

  X509_free(backend->server_cert);
  backend->server_cert = NULL;
  connssl->connecting_state = ssl_connect_done;

  return result;
}